

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmReturnCommand.cxx
# Opt level: O2

bool cmReturnCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  PolicyStatus PVar4;
  PolicyID id;
  string *this;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_30 [24];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmExecutionStatus::SetReturnInvoked(status);
    return true;
  }
  PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0140,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    pcVar1 = status->Makefile;
    local_90.View_._M_str = local_90.Digits_;
    local_90.View_._M_len = 1;
    local_90.Digits_[0] = '\n';
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b0,(cmPolicies *)0x8c,id);
    local_60.View_._M_str =
         (char *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_);
    local_60.View_._M_len = local_b0._M_string_length;
    cmStrCat<>(&local_d0,&local_90,&local_60);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    this = &local_b0;
  }
  else {
    if (PVar4 == OLD) {
      return true;
    }
    if (PVar4 == WARN) {
      pcVar1 = status->Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b0,(cmPolicies *)0x8c,id);
      local_90.View_._M_len = local_b0._M_string_length;
      local_60.View_._M_str = local_60.Digits_;
      local_60.View_._M_len = 1;
      local_60.Digits_[0] = '\n';
      cmStrCat<char[153]>(&local_d0,&local_90,&local_60,
                          (char (*) [153])
                          "return() checks its arguments when the policy is set to NEW. Since the policy is not set the OLD behavior will be used so the arguments will be ignored."
                         );
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      return true;
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __x._M_str = (pbVar2->_M_dataplus)._M_p;
    __x._M_len = pbVar2->_M_string_length;
    __y._M_str = "PROPAGATE";
    __y._M_len = 9;
    bVar3 = std::operator!=(__x,__y);
    if (!bVar3) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                (local_30,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_90);
      cmExecutionStatus::SetReturnInvoked
                (status,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
      return true;
    }
    local_90.View_._M_len = 0x22;
    local_90.View_._M_str = "called with unsupported argument \"";
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_60.View_._M_str = (pbVar2->_M_dataplus)._M_p;
    local_60.View_._M_len = pbVar2->_M_string_length;
    local_b0._M_dataplus._M_p._0_1_ = 0x22;
    cmStrCat<char>(&local_d0,&local_90,&local_60,(char *)&local_b0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this = &local_d0;
  }
  std::__cxx11::string::~string((string *)this);
  cmSystemTools::s_FatalErrorOccurred = true;
  return false;
}

Assistant:

bool cmReturnCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (!args.empty()) {
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0140)) {
      case cmPolicies::WARN:
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0140), '\n',
            "return() checks its arguments when the policy is set to NEW. "
            "Since the policy is not set the OLD behavior will be used so "
            "the arguments will be ignored."));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat('\n', cmPolicies::GetPolicyWarning(cmPolicies::CMP0140)));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      default:
        break;
    }
    if (args[0] != "PROPAGATE"_s) {
      status.SetError(
        cmStrCat("called with unsupported argument \"", args[0], '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    status.SetReturnInvoked({ args.begin() + 1, args.end() });
  } else {
    status.SetReturnInvoked();
  }
  return true;
}